

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ImGuiStyleMod *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiStyleMod *__dest;
  int iVar7;
  int iVar8;
  ImGuiContext *ctx;
  
  pIVar6 = GImGui;
  if (GStyleVarInfo[idx].Type == 8) {
    if (GStyleVarInfo[idx].Count == 1) {
      uVar3 = GStyleVarInfo[idx].Offset;
      iVar2 = *(int *)((long)&(GImGui->Style).Alpha + (ulong)uVar3);
      iVar8 = (GImGui->StyleVarStack).Size;
      iVar4 = (GImGui->StyleVarStack).Capacity;
      if (iVar8 == iVar4) {
        iVar8 = iVar8 + 1;
        if (iVar4 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar4 / 2 + iVar4;
        }
        if (iVar8 < iVar7) {
          iVar8 = iVar7;
        }
        if (iVar4 < iVar8) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (ImGuiStyleMod *)(*GImAllocatorAllocFunc)((long)iVar8 * 0xc,GImAllocatorUserData)
          ;
          pIVar5 = (pIVar6->StyleVarStack).Data;
          if (pIVar5 != (ImGuiStyleMod *)0x0) {
            memcpy(__dest,pIVar5,(long)(pIVar6->StyleVarStack).Size * 0xc);
            pIVar5 = (pIVar6->StyleVarStack).Data;
            if ((pIVar5 != (ImGuiStyleMod *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
          }
          (pIVar6->StyleVarStack).Data = __dest;
          (pIVar6->StyleVarStack).Capacity = iVar8;
        }
      }
      pIVar5 = (pIVar6->StyleVarStack).Data;
      iVar8 = (pIVar6->StyleVarStack).Size;
      pIVar5[iVar8].VarIdx = idx;
      pIVar5[iVar8].field_1.BackupInt[0] = iVar2;
      (pIVar6->StyleVarStack).Size = (pIVar6->StyleVarStack).Size + 1;
      *(float *)((long)&(pIVar6->Style).Alpha + (ulong)uVar3) = val;
    }
  }
  return;
}

Assistant:

static const ImGuiStyleVarInfo* GetStyleVarInfo(ImGuiStyleVar idx)
{
    IM_ASSERT(idx >= 0 && idx < ImGuiStyleVar_COUNT);
    IM_ASSERT(IM_ARRAYSIZE(GStyleVarInfo) == ImGuiStyleVar_COUNT);
    return &GStyleVarInfo[idx];
}